

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistogramCombineGreedy(VP8LHistogramSet *image_histo)

{
  int iVar1;
  int i_00;
  int iVar2;
  HistogramPair *pair;
  HistogramPair *in_RDI;
  HistoQueue *unaff_retaddr;
  HistogramPair *p;
  int idx2;
  int idx1;
  HistoQueue histo_queue;
  VP8LHistogram **histograms;
  int j;
  int i;
  int image_histo_size;
  int ok;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  HistoQueue *in_stack_ffffffffffffffc0;
  int *local_30;
  int local_28;
  VP8LHistogram *hout;
  int in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = in_RDI->idx1;
  hout = (VP8LHistogram *)in_RDI->cost_diff;
  iVar2 = HistoQueueInit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (iVar2 != 0) {
    for (iVar2 = 0; iVar1 = iVar2, iVar2 < iVar3; iVar2 = iVar2 + 1) {
      while (in_stack_ffffffffffffffe8 = iVar1 + 1, in_stack_ffffffffffffffe8 < iVar3) {
        HistoQueuePush((HistoQueue *)histograms,(VP8LHistogram **)histo_queue._8_8_,
                       histo_queue.queue._4_4_,(int)histo_queue.queue,_idx2);
        iVar1 = in_stack_ffffffffffffffe8;
      }
    }
    while (0 < local_28) {
      iVar1 = *local_30;
      i_00 = local_30[1];
      HistogramAdd((VP8LHistogram *)CONCAT44(iVar4,iVar3),
                   (VP8LHistogram *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),hout);
      UpdateHistogramCost(*(uint64_t *)(local_30 + 4),(uint64_t *)(local_30 + 6),
                          *(VP8LHistogram **)(hout->red + (long)iVar1 * 2 + -2));
      HistogramSetRemoveHistogram((VP8LHistogramSet *)in_RDI,i_00);
      iVar2 = 0;
      while (iVar2 < local_28) {
        pair = (HistogramPair *)(local_30 + (long)iVar2 * 0x10);
        if ((((pair->idx1 == iVar1) || (pair->idx2 == iVar1)) || (pair->idx1 == i_00)) ||
           (pair->idx2 == i_00)) {
          HistoQueuePopPair((HistoQueue *)pair,
                            (HistogramPair *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        }
        else {
          HistoQueueFixPair(in_RDI->idx1,i_00,pair);
          HistoQueueUpdateHead(unaff_retaddr,in_RDI);
          iVar2 = iVar2 + 1;
        }
      }
      for (iVar2 = 0; iVar2 < in_RDI->idx1; iVar2 = iVar2 + 1) {
        if (iVar2 != iVar1) {
          HistoQueuePush((HistoQueue *)histograms,(VP8LHistogram **)histo_queue._8_8_,
                         histo_queue.queue._4_4_,(int)histo_queue.queue,_idx2);
        }
      }
    }
    iVar4 = 1;
  }
  HistoQueueClear((HistoQueue *)0x19c4d8);
  return iVar4;
}

Assistant:

static int HistogramCombineGreedy(VP8LHistogramSet* const image_histo) {
  int ok = 0;
  const int image_histo_size = image_histo->size;
  int i, j;
  VP8LHistogram** const histograms = image_histo->histograms;
  // Priority queue of histogram pairs.
  HistoQueue histo_queue;

  // image_histo_size^2 for the queue size is safe. If you look at
  // HistogramCombineGreedy, and imagine that UpdateQueueFront always pushes
  // data to the queue, you insert at most:
  // - image_histo_size*(image_histo_size-1)/2 (the first two for loops)
  // - image_histo_size - 1 in the last for loop at the first iteration of
  //   the while loop, image_histo_size - 2 at the second iteration ...
  //   therefore image_histo_size*(image_histo_size-1)/2 overall too
  if (!HistoQueueInit(&histo_queue, image_histo_size * image_histo_size)) {
    goto End;
  }

  // Initialize the queue.
  for (i = 0; i < image_histo_size; ++i) {
    for (j = i + 1; j < image_histo_size; ++j) {
      HistoQueuePush(&histo_queue, histograms, i, j, 0);
    }
  }

  while (histo_queue.size > 0) {
    const int idx1 = histo_queue.queue[0].idx1;
    const int idx2 = histo_queue.queue[0].idx2;
    HistogramAdd(histograms[idx2], histograms[idx1], histograms[idx1]);
    UpdateHistogramCost(histo_queue.queue[0].cost_combo,
                        histo_queue.queue[0].costs, histograms[idx1]);

    // Remove merged histogram.
    HistogramSetRemoveHistogram(image_histo, idx2);

    // Remove pairs intersecting the just combined best pair.
    for (i = 0; i < histo_queue.size;) {
      HistogramPair* const p = histo_queue.queue + i;
      if (p->idx1 == idx1 || p->idx2 == idx1 ||
          p->idx1 == idx2 || p->idx2 == idx2) {
        HistoQueuePopPair(&histo_queue, p);
      } else {
        HistoQueueFixPair(image_histo->size, idx2, p);
        HistoQueueUpdateHead(&histo_queue, p);
        ++i;
      }
    }

    // Push new pairs formed with combined histogram to the queue.
    for (i = 0; i < image_histo->size; ++i) {
      if (i == idx1) continue;
      HistoQueuePush(&histo_queue, image_histo->histograms, idx1, i, 0);
    }
  }

  ok = 1;

 End:
  HistoQueueClear(&histo_queue);
  return ok;
}